

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestate.c
# Opt level: O3

void transfer_state(_Bool load,char *path,em8051 *emu)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined3 uVar54;
  undefined5 uVar55;
  undefined1 auVar56 [12];
  undefined1 auVar57 [14];
  undefined7 in_register_00000039;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined4 local_48;
  undefined4 uStack_44;
  byte bStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  byte local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  uint local_28;
  
  transfer_data(load,path,"flash.bin",flash,0x20000);
  transfer_data(load,path,"intmem.bin",emu->mLowerData,0x100);
  transfer_data(load,path,"extmem.bin",emu->mExtData,0x10000);
  transfer_data(load,path,"ram.bin",ram,0x80000);
  transfer_data(load,path,"sfr.bin",emu->mSFR,0x80);
  uVar1._0_4_ = emu->mPC;
  uVar1._4_4_ = emu->mTickDelay;
  uVar2._0_4_ = emu->mInterruptActive;
  uVar2._4_4_ = emu->int_a[0];
  auVar22._8_6_ = 0;
  auVar22._0_8_ = uVar2;
  auVar22[0xe] = (char)((uint)uVar2._4_4_ >> 0x18);
  auVar26._8_4_ = 0;
  auVar26._0_8_ = uVar2;
  auVar26[0xc] = (char)((uint)uVar2._4_4_ >> 0x10);
  auVar26._13_2_ = auVar22._13_2_;
  auVar29._8_4_ = 0;
  auVar29._0_8_ = uVar2;
  auVar29._12_3_ = auVar26._12_3_;
  auVar33._8_2_ = 0;
  auVar33._0_8_ = uVar2;
  auVar33[10] = (char)((uint)uVar2._4_4_ >> 8);
  auVar33._11_4_ = auVar29._11_4_;
  auVar36._8_2_ = 0;
  auVar36._0_8_ = uVar2;
  auVar36._10_5_ = auVar33._10_5_;
  auVar40[8] = (char)uVar2._4_4_;
  auVar40._0_8_ = uVar2;
  auVar40._9_6_ = auVar36._9_6_;
  auVar42._7_8_ = 0;
  auVar42._0_7_ = auVar40._8_7_;
  auVar46._1_8_ = SUB158(auVar42 << 0x40,7);
  auVar46[0] = (char)((uint)(undefined4)uVar2 >> 0x18);
  auVar46._9_6_ = 0;
  auVar47._1_10_ = SUB1510(auVar46 << 0x30,5);
  auVar47[0] = (char)((uint)(undefined4)uVar2 >> 0x10);
  auVar47._11_4_ = 0;
  auVar62._3_12_ = SUB1512(auVar47 << 0x20,3);
  auVar62[2] = (char)((uint)(undefined4)uVar2 >> 8);
  auVar62[0] = (byte)(undefined4)uVar2;
  auVar62[1] = 0;
  auVar62[0xf] = 0;
  auVar59 = pshuflw(auVar62,auVar62,0x1b);
  auVar60 = pshufhw(auVar59,auVar59,0x1b);
  auVar20._8_6_ = 0;
  auVar20._0_8_ = uVar1;
  auVar20[0xe] = (char)((uint)uVar1._4_4_ >> 0x18);
  auVar23._8_4_ = 0;
  auVar23._0_8_ = uVar1;
  auVar23[0xc] = (char)((uint)uVar1._4_4_ >> 0x10);
  auVar23._13_2_ = auVar20._13_2_;
  auVar27._8_4_ = 0;
  auVar27._0_8_ = uVar1;
  auVar27._12_3_ = auVar23._12_3_;
  auVar30._8_2_ = 0;
  auVar30._0_8_ = uVar1;
  auVar30[10] = (char)((uint)uVar1._4_4_ >> 8);
  auVar30._11_4_ = auVar27._11_4_;
  auVar34._8_2_ = 0;
  auVar34._0_8_ = uVar1;
  auVar34._10_5_ = auVar30._10_5_;
  auVar37[8] = (char)uVar1._4_4_;
  auVar37._0_8_ = uVar1;
  auVar37._9_6_ = auVar34._9_6_;
  auVar43._7_8_ = 0;
  auVar43._0_7_ = auVar37._8_7_;
  auVar48._1_8_ = SUB158(auVar43 << 0x40,7);
  auVar48[0] = (char)((uint)(undefined4)uVar1 >> 0x18);
  auVar48._9_6_ = 0;
  auVar49._1_10_ = SUB1510(auVar48 << 0x30,5);
  auVar49[0] = (char)((uint)(undefined4)uVar1 >> 0x10);
  auVar49._11_4_ = 0;
  auVar41[2] = (char)((uint)(undefined4)uVar1 >> 8);
  auVar41._0_2_ = (ushort)(undefined4)uVar1;
  auVar41._3_12_ = SUB1512(auVar49 << 0x20,3);
  auVar59._0_2_ = (ushort)(undefined4)uVar1 & 0xff;
  auVar59._2_13_ = auVar41._2_13_;
  auVar59[0xf] = 0;
  auVar59 = pshuflw(auVar59,auVar59,0x1b);
  auVar59 = pshufhw(auVar59,auVar59,0x1b);
  sVar4 = auVar59._0_2_;
  sVar5 = auVar59._2_2_;
  sVar6 = auVar59._4_2_;
  sVar7 = auVar59._6_2_;
  sVar8 = auVar59._8_2_;
  sVar9 = auVar59._10_2_;
  sVar10 = auVar59._12_2_;
  sVar11 = auVar59._14_2_;
  sVar12 = auVar60._0_2_;
  bStack_40 = (0 < sVar12) * (sVar12 < 0x100) * auVar60[0] - (0xff < sVar12);
  sVar12 = auVar60._2_2_;
  cStack_3f = (0 < sVar12) * (sVar12 < 0x100) * auVar60[2] - (0xff < sVar12);
  sVar12 = auVar60._4_2_;
  cStack_3e = (0 < sVar12) * (sVar12 < 0x100) * auVar60[4] - (0xff < sVar12);
  sVar12 = auVar60._6_2_;
  cStack_3d = (0 < sVar12) * (sVar12 < 0x100) * auVar60[6] - (0xff < sVar12);
  sVar12 = auVar60._8_2_;
  cStack_3c = (0 < sVar12) * (sVar12 < 0x100) * auVar60[8] - (0xff < sVar12);
  sVar12 = auVar60._10_2_;
  cStack_3b = (0 < sVar12) * (sVar12 < 0x100) * auVar60[10] - (0xff < sVar12);
  sVar12 = auVar60._12_2_;
  cStack_3a = (0 < sVar12) * (sVar12 < 0x100) * auVar60[0xc] - (0xff < sVar12);
  sVar12 = auVar60._14_2_;
  cStack_39 = (0 < sVar12) * (sVar12 < 0x100) * auVar60[0xe] - (0xff < sVar12);
  local_48 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar59[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar59[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar59[2] - (0xff < sVar5),
                                        (0 < sVar4) * (sVar4 < 0x100) * auVar59[0] - (0xff < sVar4))
                              ));
  uStack_44 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar59[0xe] - (0xff < sVar11),
                       CONCAT12((0 < sVar10) * (sVar10 < 0x100) * auVar59[0xc] - (0xff < sVar10),
                                CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar59[10] -
                                         (0xff < sVar9),
                                         (0 < sVar8) * (sVar8 < 0x100) * auVar59[8] - (0xff < sVar8)
                                        )));
  auVar59 = *(undefined1 (*) [16])(emu->int_a + 1);
  auVar61[1] = 0;
  auVar61[0] = auVar59[8];
  auVar61[2] = auVar59[9];
  auVar61[3] = 0;
  auVar61[4] = auVar59[10];
  auVar61[5] = 0;
  auVar61[6] = auVar59[0xb];
  auVar61[7] = 0;
  auVar61[8] = auVar59[0xc];
  auVar61[9] = 0;
  auVar61[10] = auVar59[0xd];
  auVar61[0xb] = 0;
  auVar61[0xc] = auVar59[0xe];
  auVar61[0xd] = 0;
  auVar61[0xe] = auVar59[0xf];
  auVar61[0xf] = 0;
  auVar60 = pshuflw(auVar61,auVar61,0x1b);
  auVar62 = pshufhw(auVar60,auVar60,0x1b);
  auVar21[0xd] = 0;
  auVar21._0_13_ = auVar59._0_13_;
  auVar21[0xe] = auVar59[7];
  auVar24[0xc] = auVar59[6];
  auVar24._0_12_ = auVar59._0_12_;
  auVar24._13_2_ = auVar21._13_2_;
  auVar28[0xb] = 0;
  auVar28._0_11_ = auVar59._0_11_;
  auVar28._12_3_ = auVar24._12_3_;
  auVar31[10] = auVar59[5];
  auVar31._0_10_ = auVar59._0_10_;
  auVar31._11_4_ = auVar28._11_4_;
  auVar35[9] = 0;
  auVar35._0_9_ = auVar59._0_9_;
  auVar35._10_5_ = auVar31._10_5_;
  auVar38[8] = auVar59[4];
  auVar38._0_8_ = auVar59._0_8_;
  auVar38._9_6_ = auVar35._9_6_;
  auVar44._7_8_ = 0;
  auVar44._0_7_ = auVar38._8_7_;
  auVar50._1_8_ = SUB158(auVar44 << 0x40,7);
  auVar50[0] = auVar59[3];
  auVar50._9_6_ = 0;
  auVar51._1_10_ = SUB1510(auVar50 << 0x30,5);
  auVar51[0] = auVar59[2];
  auVar51._11_4_ = 0;
  auVar60._3_12_ = SUB1512(auVar51 << 0x20,3);
  auVar60[2] = auVar59[1];
  auVar60[0] = auVar59[0];
  auVar60[1] = 0;
  auVar60[0xf] = 0;
  auVar59 = pshuflw(auVar60,auVar60,0x1b);
  auVar59 = pshufhw(auVar59,auVar59,0x1b);
  sVar4 = auVar59._0_2_;
  local_38 = (0 < sVar4) * (sVar4 < 0x100) * auVar59[0] - (0xff < sVar4);
  sVar4 = auVar59._2_2_;
  cStack_37 = (0 < sVar4) * (sVar4 < 0x100) * auVar59[2] - (0xff < sVar4);
  sVar4 = auVar59._4_2_;
  cStack_36 = (0 < sVar4) * (sVar4 < 0x100) * auVar59[4] - (0xff < sVar4);
  sVar4 = auVar59._6_2_;
  cStack_35 = (0 < sVar4) * (sVar4 < 0x100) * auVar59[6] - (0xff < sVar4);
  sVar4 = auVar59._8_2_;
  cStack_34 = (0 < sVar4) * (sVar4 < 0x100) * auVar59[8] - (0xff < sVar4);
  sVar4 = auVar59._10_2_;
  cStack_33 = (0 < sVar4) * (sVar4 < 0x100) * auVar59[10] - (0xff < sVar4);
  sVar4 = auVar59._12_2_;
  cStack_32 = (0 < sVar4) * (sVar4 < 0x100) * auVar59[0xc] - (0xff < sVar4);
  sVar4 = auVar59._14_2_;
  cStack_31 = (0 < sVar4) * (sVar4 < 0x100) * auVar59[0xe] - (0xff < sVar4);
  sVar4 = auVar62._0_2_;
  sVar5 = auVar62._2_2_;
  sVar6 = auVar62._4_2_;
  sVar7 = auVar62._6_2_;
  sVar8 = auVar62._8_2_;
  sVar9 = auVar62._10_2_;
  sVar10 = auVar62._12_2_;
  sVar11 = auVar62._14_2_;
  uStack_30 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar62[6] - (0xff < sVar7),
                       CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar62[4] - (0xff < sVar6),
                                CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar62[2] - (0xff < sVar5)
                                         ,(0 < sVar4) * (sVar4 < 0x100) * auVar62[0] -
                                          (0xff < sVar4))));
  uStack_2c = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar62[0xe] - (0xff < sVar11),
                       CONCAT12((0 < sVar10) * (sVar10 < 0x100) * auVar62[0xc] - (0xff < sVar10),
                                CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar62[10] -
                                         (0xff < sVar9),
                                         (0 < sVar8) * (sVar8 < 0x100) * auVar62[8] - (0xff < sVar8)
                                        )));
  uVar3 = emu->int_sp[1];
  local_28 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  transfer_data(load,path,"cpu.bin",(uint8_t *)&local_48,0x24);
  if ((int)CONCAT71(in_register_00000039,load) != 0) {
    emu->mPC = local_48 >> 0x18 | (local_48 & 0xff0000) >> 8 | (local_48 & 0xff00) << 8 |
               local_48 << 0x18;
    emu->mTickDelay =
         uStack_44 >> 0x18 | (uStack_44 & 0xff0000) >> 8 | (uStack_44 & 0xff00) << 8 |
         uStack_44 << 0x18;
    uVar54 = CONCAT12(cStack_37,CONCAT11(local_38,cStack_39));
    uVar3 = CONCAT13(cStack_36,uVar54);
    uVar55 = CONCAT14(cStack_35,uVar3);
    auVar57[5] = cStack_34;
    auVar57._0_5_ = uVar55;
    auVar63[1] = 0;
    auVar63[0] = local_38;
    auVar63[2] = cStack_37;
    auVar63[3] = 0;
    auVar63[4] = cStack_36;
    auVar63[5] = 0;
    auVar63[6] = cStack_35;
    auVar63[7] = 0;
    auVar63[8] = cStack_34;
    auVar63[9] = 0;
    auVar63[10] = cStack_33;
    auVar63[0xb] = 0;
    auVar63[0xc] = cStack_32;
    auVar63[0xd] = 0;
    auVar63[0xe] = cStack_31;
    auVar63[0xf] = 0;
    auVar59 = pshuflw(auVar63,auVar63,0x1b);
    auVar60 = pshufhw(auVar59,auVar59,0x1b);
    auVar57._6_8_ = 0;
    auVar25[0xe] = cStack_39;
    auVar25._0_14_ = auVar57 << 0x38;
    auVar56._4_8_ = 0;
    auVar56._0_4_ = uVar3;
    auVar32._12_3_ = (int3)(CONCAT26(auVar25._13_2_,CONCAT15(cStack_3a,uVar55)) >> 0x28);
    auVar32._0_12_ = auVar56 << 0x38;
    auVar39._10_5_ = (int5)(CONCAT44(auVar32._11_4_,CONCAT13(cStack_3b,uVar54)) >> 0x18);
    auVar39._0_10_ = (unkuint10)CONCAT11(local_38,cStack_39) << 0x38;
    auVar45._7_8_ = 0;
    auVar45._0_7_ = (uint7)(CONCAT62(auVar39._9_6_,CONCAT11(cStack_3c,cStack_39)) >> 8);
    auVar52._1_8_ = SUB158(auVar45 << 0x40,7);
    auVar52[0] = cStack_3d;
    auVar52._9_6_ = 0;
    auVar53._1_10_ = SUB1510(auVar52 << 0x30,5);
    auVar53[0] = cStack_3e;
    auVar53._11_4_ = 0;
    auVar58._3_12_ = SUB1512(auVar53 << 0x20,3);
    auVar58[2] = cStack_3f;
    auVar58[1] = 0;
    auVar58[0] = bStack_40;
    auVar58[0xf] = 0;
    auVar59 = pshuflw(auVar58,auVar58,0x1b);
    auVar59 = pshufhw(auVar59,auVar59,0x1b);
    sVar4 = auVar59._0_2_;
    sVar5 = auVar59._2_2_;
    sVar6 = auVar59._4_2_;
    sVar7 = auVar59._6_2_;
    sVar8 = auVar59._8_2_;
    sVar9 = auVar59._10_2_;
    sVar10 = auVar59._12_2_;
    sVar11 = auVar59._14_2_;
    sVar12 = auVar60._0_2_;
    sVar13 = auVar60._2_2_;
    sVar14 = auVar60._4_2_;
    sVar15 = auVar60._6_2_;
    sVar16 = auVar60._8_2_;
    sVar17 = auVar60._10_2_;
    sVar18 = auVar60._12_2_;
    sVar19 = auVar60._14_2_;
    *(char *)&emu->mInterruptActive = (0 < sVar4) * (sVar4 < 0x100) * auVar59[0] - (0xff < sVar4);
    *(char *)((long)&emu->mInterruptActive + 1) =
         (0 < sVar5) * (sVar5 < 0x100) * auVar59[2] - (0xff < sVar5);
    *(char *)((long)&emu->mInterruptActive + 2) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar59[4] - (0xff < sVar6);
    *(char *)((long)&emu->mInterruptActive + 3) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar59[6] - (0xff < sVar7);
    *(char *)emu->int_a = (0 < sVar8) * (sVar8 < 0x100) * auVar59[8] - (0xff < sVar8);
    *(char *)((long)emu->int_a + 1) = (0 < sVar9) * (sVar9 < 0x100) * auVar59[10] - (0xff < sVar9);
    *(char *)((long)emu->int_a + 2) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar59[0xc] - (0xff < sVar10);
    *(char *)((long)emu->int_a + 3) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar59[0xe] - (0xff < sVar11);
    *(char *)(emu->int_a + 1) = (0 < sVar12) * (sVar12 < 0x100) * auVar60[0] - (0xff < sVar12);
    *(char *)((long)emu->int_a + 5) = (0 < sVar13) * (sVar13 < 0x100) * auVar60[2] - (0xff < sVar13)
    ;
    *(char *)((long)emu->int_a + 6) = (0 < sVar14) * (sVar14 < 0x100) * auVar60[4] - (0xff < sVar14)
    ;
    *(char *)((long)emu->int_a + 7) = (0 < sVar15) * (sVar15 < 0x100) * auVar60[6] - (0xff < sVar15)
    ;
    *(char *)emu->int_psw = (0 < sVar16) * (sVar16 < 0x100) * auVar60[8] - (0xff < sVar16);
    *(char *)((long)emu->int_psw + 1) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar60[10] - (0xff < sVar17);
    *(char *)((long)emu->int_psw + 2) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar60[0xc] - (0xff < sVar18);
    *(char *)((long)emu->int_psw + 3) =
         (0 < sVar19) * (sVar19 < 0x100) * auVar60[0xe] - (0xff < sVar19);
    emu->int_psw[1] =
         uStack_30 >> 0x18 | (uStack_30 & 0xff0000) >> 8 | (uStack_30 & 0xff00) << 8 |
         uStack_30 << 0x18;
    emu->int_sp[0] =
         uStack_2c >> 0x18 | (uStack_2c & 0xff0000) >> 8 | (uStack_2c & 0xff00) << 8 |
         uStack_2c << 0x18;
    emu->int_sp[1] =
         local_28 >> 0x18 | (local_28 & 0xff0000) >> 8 | (local_28 & 0xff00) << 8 | local_28 << 0x18
    ;
    (*emu->sfrwrite)(emu,0x90);
    return;
  }
  return;
}

Assistant:

static void transfer_state(bool load, const char* path, struct em8051* emu) {
  transfer_data(load, path, "flash.bin", flash, sizeof(flash));
  transfer_data(load, path, "intmem.bin", emu->mLowerData, 0x100);
  transfer_data(load, path, "extmem.bin", emu->mExtData, 0x10000); // Mirror of MMIO
  transfer_data(load, path, "ram.bin", ram, sizeof(ram));
  transfer_data(load, path, "sfr.bin", emu->mSFR, 0x80);

  uint32_t cpu[] = {
    htonl(emu->mPC),
    htonl(emu->mTickDelay),
    htonl(emu->mInterruptActive),
    htonl(emu->int_a[0]), htonl(emu->int_a[1]),
    htonl(emu->int_psw[0]), htonl(emu->int_psw[1]),
    htonl(emu->int_sp[0]), htonl(emu->int_sp[1])
  };
  transfer_data(load, path, "cpu.bin", (uint8_t*)cpu, sizeof(cpu));
  if (load) {
    uint32_t* cursor = cpu;
    emu->mPC = ntohl(*cursor++);
    emu->mTickDelay = ntohl(*cursor++);
    emu->mInterruptActive = ntohl(*cursor++);
    emu->int_a[0] = ntohl(*cursor++); emu->int_a[1] = ntohl(*cursor++);
    emu->int_psw[0] = ntohl(*cursor++); emu->int_psw[1] = ntohl(*cursor++);
    emu->int_sp[0] = ntohl(*cursor++); emu->int_sp[1] = ntohl(*cursor++);
  }

  if (load) {

    // Trigger a bank switch
    emu->sfrwrite(emu, 0x80 + REG_P1);

  }
}